

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_StageERKFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  realtype *prVar1;
  int iVar2;
  MRIStepInnerStepper stepper;
  double dVar3;
  double t0;
  
  prVar1 = step_mem->MRIC->c;
  dVar3 = prVar1[(long)is + -1];
  t0 = ark_mem->h * dVar3 + ark_mem->tn;
  dVar3 = prVar1[is] - dVar3;
  iVar2 = mriStep_ComputeInnerForcing(step_mem,is,dVar3);
  if (iVar2 == 0) {
    stepper = step_mem->stepper;
    stepper->tshift = t0;
    stepper->tscale = dVar3 * ark_mem->h;
    if (step_mem->pre_inner_evolve != (MRIStepPreInnerFn)0x0) {
      iVar2 = (*step_mem->pre_inner_evolve)
                        (t0,stepper->forcing,stepper->nforcing,ark_mem->user_data);
      if (iVar2 != 0) {
        return -0x23;
      }
      stepper = step_mem->stepper;
    }
    iVar2 = mriStepInnerStepper_Evolve(stepper,t0,ark_mem->tcur,ark_mem->ycur);
    if (iVar2 < 0) {
      iVar2 = -0x22;
    }
    else if ((step_mem->post_inner_evolve == (MRIStepPostInnerFn)0x0) ||
            (iVar2 = (*step_mem->post_inner_evolve)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
            iVar2 == 0)) {
      iVar2 = 0;
    }
    else {
      iVar2 = -0x24;
    }
  }
  return iVar2;
}

Assistant:

int mriStep_StageERKFast(ARKodeMem ark_mem,
                         ARKodeMRIStepMem step_mem, int is)
{
  realtype cdiff;    /* stage time increment */
  realtype t0;       /* start time for stage */
  int retval;        /* reusable return flag */

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK fast stage\n");
#endif

  /* Set initial time for fast evolution */
  t0 = ark_mem->tn + step_mem->MRIC->c[is-1]*ark_mem->h;

  /* compute the inner forcing */
  cdiff = step_mem->MRIC->c[is] - step_mem->MRIC->c[is-1];
  retval = mriStep_ComputeInnerForcing(step_mem, is, cdiff);
  if (retval != ARK_SUCCESS) return(retval);

  /* Set inner forcing time normalization constants */
  step_mem->stepper->tshift = t0;
  step_mem->stepper->tscale = cdiff * ark_mem->h;

  /* pre inner evolve function (if supplied) */
  if (step_mem->pre_inner_evolve) {
    retval = step_mem->pre_inner_evolve(t0, step_mem->stepper->forcing,
                                        step_mem->stepper->nforcing,
                                        ark_mem->user_data);
    if (retval != 0) return(ARK_OUTERTOINNER_FAIL);
  }

  /* advance inner method in time */
  retval = mriStepInnerStepper_Evolve(step_mem->stepper, t0, ark_mem->tcur,
                                      ark_mem->ycur);
  if (retval < 0) return(ARK_INNERSTEP_FAIL);

  /* post inner evolve function (if supplied) */
  if (step_mem->post_inner_evolve) {
    retval = step_mem->post_inner_evolve(ark_mem->tcur, ark_mem->ycur,
                                         ark_mem->user_data);
    if (retval != 0) return(ARK_INNERTOOUTER_FAIL);
  }

  /* return with success */
  return(ARK_SUCCESS);
}